

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.hh
# Opt level: O2

void __thiscall
avro::ReaderImpl<avro::NullValidator>::readValue(ReaderImpl<avro::NullValidator> *this,double *val)

{
  undefined1 in_AL;
  undefined7 in_register_00000001;
  anon_union_8_2_94730066 v;
  double local_18;
  
  local_18 = (double)CONCAT71(in_register_00000001,in_AL);
  BufferReader::read<unsigned_long>((BufferReader *)(this + 8),(unsigned_long *)&local_18);
  *val = local_18;
  return;
}

Assistant:

void readValue(double &val) {
        validator_.checkTypeExpected(AVRO_DOUBLE);
        union { 
            double d;
            uint64_t i;
        } v;
        reader_.read(v.i);
        val = v.d;
    }